

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitPositionOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,int *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bitstring_t substring;
  bitstring_t substring_00;
  bitstring_t substring_01;
  bitstring_t bits;
  bitstring_t bits_00;
  bitstring_t bits_01;
  ulong local_60;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar9 = 0;
      do {
        uVar2 = *(undefined8 *)((long)&ldata->value + lVar9 * 4);
        uVar3 = *(undefined8 *)((long)&rdata->value + lVar9 * 4);
        uVar5 = 0;
        if ((uint)uVar2 <= (uint)uVar3) {
          substring_01.value.pointer.ptr =
               (char *)*(undefined8 *)((long)&ldata->value + lVar9 * 4 + 8);
          substring_01.value._0_8_ = uVar2;
          bits_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + lVar9 * 4 + 8);
          bits_01.value._0_8_ = uVar3;
          iVar6 = Bit::BitPosition(substring_01,bits_01);
          uVar5 = (undefined4)iVar6;
        }
        *(undefined4 *)((long)result_data + lVar9) = uVar5;
        lVar9 = lVar9 + 4;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = 0;
    uVar10 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar7 = count;
        }
LAB_01ac31e1:
        uVar8 = uVar10;
        if (uVar10 < uVar7) {
          uVar12 = uVar10 << 4 | 8;
          do {
            uVar2 = *(undefined8 *)((long)ldata + (uVar12 - 8));
            uVar3 = *(undefined8 *)((long)rdata + (uVar12 - 8));
            iVar4 = 0;
            if ((uint)uVar2 <= (uint)uVar3) {
              substring.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar12);
              substring.value._0_8_ = uVar2;
              bits.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + uVar12);
              bits.value._0_8_ = uVar3;
              iVar6 = Bit::BitPosition(substring,bits);
              iVar4 = (int)iVar6;
            }
            result_data[uVar10] = iVar4;
            uVar10 = uVar10 + 1;
            uVar12 = uVar12 + 0x10;
            uVar8 = uVar7;
          } while (uVar7 != uVar10);
        }
      }
      else {
        uVar12 = puVar1[local_60];
        uVar7 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar7 = count;
        }
        uVar8 = uVar7;
        if (uVar12 != 0) {
          if (uVar12 == 0xffffffffffffffff) goto LAB_01ac31e1;
          uVar8 = uVar10;
          if (uVar10 < uVar7) {
            uVar11 = uVar10 << 4 | 8;
            uVar13 = 0;
            do {
              if ((uVar12 >> (uVar13 & 0x3f) & 1) != 0) {
                uVar2 = *(undefined8 *)((long)ldata + (uVar11 - 8));
                uVar3 = *(undefined8 *)((long)rdata + (uVar11 - 8));
                iVar4 = 0;
                if ((uint)uVar2 <= (uint)uVar3) {
                  substring_00.value.pointer.ptr =
                       (char *)*(undefined8 *)((long)&ldata->value + uVar11);
                  substring_00.value._0_8_ = uVar2;
                  bits_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&rdata->value + uVar11);
                  bits_00.value._0_8_ = uVar3;
                  iVar6 = Bit::BitPosition(substring_00,bits_00);
                  iVar4 = (int)iVar6;
                }
                result_data[uVar10 + uVar13] = iVar4;
              }
              uVar13 = uVar13 + 1;
              uVar11 = uVar11 + 0x10;
              uVar8 = uVar7;
            } while (uVar7 - uVar10 != uVar13);
          }
        }
      }
      local_60 = local_60 + 1;
      uVar10 = uVar8;
    } while (local_60 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}